

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index.h
# Opt level: O3

void __thiscall
booster::locale::boundary::details::boundary_point_index_iterator<std::_List_iterator<wchar_t>_>::
decrement(boundary_point_index_iterator<std::_List_iterator<wchar_t>_> *this)

{
  uint *puVar1;
  element_type *peVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  size_t pos;
  ulong uVar6;
  long lVar7;
  
  uVar5 = this->current_;
  if (uVar5 == 0) {
    update_current(this,0);
    return;
  }
  lVar7 = uVar5 * 0x10 + -8;
  uVar4 = uVar5;
  while (uVar6 = uVar4 - 1, uVar6 != 0) {
    uVar5 = uVar5 - 1;
    peVar2 = (this->map_->index_).
             super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    lVar3 = (long)(peVar2->
                  super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    pos = uVar5;
    if (((ulong)((long)(peVar2->
                       super__Vector_base<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>
                       )._M_impl.super__Vector_impl_data._M_finish - lVar3 >> 4) <= uVar4) ||
       (puVar1 = (uint *)(lVar3 + lVar7), pos = uVar6, lVar7 = lVar7 + -0x10, uVar4 = uVar6,
       (*puVar1 & this->mask_) != 0)) goto LAB_00123555;
  }
  pos = 0;
LAB_00123555:
  update_current(this,pos);
  return;
}

Assistant:

void decrement()
                    {
                        size_t next = current_;
                        while(next>0) {
                            next--;
                            if(valid_offset(next))
                                break;
                        }
                        update_current(next);
                    }